

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O1

void * direct_alloc(size_t nb)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  ulong uVar4;
  ulong __len;
  
  __len = nb + 0x1036 & 0xfffffffffffff000;
  if (nb < __len) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    pvVar3 = mmap64((void *)0x0,__len,3,0x62,-1,0);
    *piVar2 = iVar1;
    if (pvVar3 != (void *)0xffffffffffffffff) {
      uVar4 = (ulong)(-(int)pvVar3 - 0x10U & 7);
      *(ulong *)((long)pvVar3 + uVar4) = uVar4 | 1;
      *(ulong *)((long)pvVar3 + uVar4 + 8) = (__len - uVar4) - 0x20 | 2;
      *(undefined8 *)((long)pvVar3 + (__len - uVar4) + -0x18 + uVar4) = 0xb;
      *(undefined8 *)((long)pvVar3 + (__len - 0x10)) = 0;
      return (void *)((long)pvVar3 + uVar4 + 0x10);
    }
  }
  return (void *)0x0;
}

Assistant:

static void *direct_alloc(size_t nb)
{
  size_t mmsize = mmap_align(nb + SIX_SIZE_T_SIZES + CHUNK_ALIGN_MASK);
  if (LJ_LIKELY(mmsize > nb)) {     /* Check for wrap around 0 */
    char *mm = (char *)(DIRECT_MMAP(mmsize));
    if (mm != CMFAIL) {
      size_t offset = align_offset(chunk2mem(mm));
      size_t psize = mmsize - offset - DIRECT_FOOT_PAD;
      mchunkptr p = (mchunkptr)(mm + offset);
      p->prev_foot = offset | IS_DIRECT_BIT;
      p->head = psize|CINUSE_BIT;
      chunk_plus_offset(p, psize)->head = FENCEPOST_HEAD;
      chunk_plus_offset(p, psize+SIZE_T_SIZE)->head = 0;
      return chunk2mem(p);
    }
  }
  return NULL;
}